

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack1to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  uint uVar11;
  ulong uVar12;
  uint _h;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  undefined1 *puVar19;
  undefined1 (*pauVar20) [16];
  size_t _elemsize;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong *puVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  undefined1 *puVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iVar8 = cpu_support_x86_avx2();
  if (iVar8 != 0) {
    im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar8 = cpu_support_x86_xop();
  if (iVar8 == 0) {
    uVar1 = bottom_im2col->w;
    iVar8 = bottom_im2col->h;
    uVar13 = bottom_im2col->c;
    lVar15 = (long)(int)uVar13;
    local_48 = (ulong)(uint)top_blob->c;
    local_58 = 0;
    local_98._0_8_ = (void *)0x0;
    local_98._8_4_ = 0;
    local_98._12_4_ = 0;
    local_98._16_8_ = 0;
    local_98._24_4_ = 0;
    local_98._32_8_ = (Allocator *)0x0;
    local_98._40_4_ = 0;
    local_98._44_4_ = 0;
    local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
    iVar9 = 4;
    iVar18 = iVar8;
    uVar11 = uVar1;
    if (lVar15 < 4) {
      _elemsize = 1;
      iVar9 = 1;
      _h = uVar13;
      if (1 < (int)uVar1) {
        iVar18 = iVar8 * 2;
        uVar11 = (uVar1 & 1) + (uVar1 >> 1);
      }
    }
    else {
      _elemsize = 4;
      if ((int)uVar1 < 2) {
        _h = (uVar13 & 3) + (uVar13 >> 2);
      }
      else {
        _h = (uVar13 & 3) + (uVar13 >> 2);
        iVar18 = iVar8 * 2;
        uVar11 = (uVar1 & 1) + (uVar1 >> 1);
      }
    }
    Mat::create((Mat *)local_98,iVar18,_h,uVar11,_elemsize,iVar9,opt->workspace_allocator);
    uVar12 = 0;
    iVar9 = 0;
    if (0 < iVar8) {
      iVar9 = iVar8;
    }
    uVar17 = (ulong)(int)uVar1;
    local_40 = (ulong)(uint)((int)uVar1 >> 1);
    if ((int)uVar1 >> 1 < 1) {
      local_40 = uVar12;
    }
    uVar29 = 0;
    while (uVar28 = uVar29, uVar28 != local_40) {
      puVar27 = (undefined1 *)(local_58 * uVar28 * local_98._16_8_ + local_98._0_8_);
      lVar23 = 1;
      lVar21 = 2;
      lVar14 = 3;
      for (uVar29 = 0; (long)(uVar29 | 3) < lVar15; uVar29 = uVar29 + 4) {
        lVar16 = bottom_im2col->cstep * bottom_im2col->elemsize;
        lVar25 = (long)bottom_im2col->data + uVar12;
        iVar18 = iVar9;
        while (bVar30 = iVar18 != 0, iVar18 = iVar18 + -1, bVar30) {
          *puVar27 = *(undefined1 *)(lVar25 + lVar16 * uVar29);
          puVar27[1] = *(undefined1 *)(lVar25 + lVar16 * lVar23);
          puVar27[2] = *(undefined1 *)(lVar25 + lVar16 * lVar21);
          puVar27[3] = *(undefined1 *)(lVar25 + lVar16 * lVar14);
          puVar27[4] = *(undefined1 *)(lVar25 + 1 + lVar16 * uVar29);
          puVar27[5] = *(undefined1 *)(lVar25 + 1 + lVar16 * lVar23);
          puVar27[6] = *(undefined1 *)(lVar25 + 1 + lVar16 * lVar21);
          puVar27[7] = *(undefined1 *)(lVar25 + 1 + lVar16 * lVar14);
          puVar27 = puVar27 + 8;
          lVar25 = lVar25 + uVar17;
        }
        lVar14 = lVar14 + 4;
        lVar21 = lVar21 + 4;
        lVar23 = lVar23 + 4;
      }
      for (; (long)uVar29 < lVar15; uVar29 = uVar29 + 1) {
        pvVar10 = (void *)(bottom_im2col->cstep * bottom_im2col->elemsize * uVar29 +
                          (long)bottom_im2col->data);
        iVar18 = iVar9;
        while (bVar30 = iVar18 != 0, iVar18 = iVar18 + -1, bVar30) {
          *puVar27 = *(undefined1 *)((long)pvVar10 + uVar12);
          puVar27[1] = *(undefined1 *)((long)pvVar10 + uVar12 + 1);
          puVar27 = puVar27 + 2;
          pvVar10 = (void *)((long)pvVar10 + uVar17);
        }
      }
      uVar12 = uVar12 + 2;
      local_38 = uVar28;
      uVar29 = uVar28 + 1;
    }
    for (uVar12 = uVar17 & 0xfffffffffffffffe; (long)uVar12 < (long)uVar17; uVar12 = uVar12 + 1) {
      uVar29 = (ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff;
      puVar27 = (undefined1 *)
                ((long)((int)((long)uVar29 % 2) + (int)((long)uVar29 / 2)) * local_58 *
                 local_98._16_8_ + local_98._0_8_);
      lVar23 = 1;
      lVar21 = 2;
      lVar14 = 3;
      for (uVar29 = 0; (long)(uVar29 | 3) < lVar15; uVar29 = uVar29 + 4) {
        lVar16 = bottom_im2col->cstep * bottom_im2col->elemsize;
        lVar25 = (long)bottom_im2col->data + uVar12;
        iVar18 = iVar9;
        while (bVar30 = iVar18 != 0, iVar18 = iVar18 + -1, bVar30) {
          *puVar27 = *(undefined1 *)(lVar25 + lVar16 * uVar29);
          puVar27[1] = *(undefined1 *)(lVar25 + lVar16 * lVar23);
          puVar27[2] = *(undefined1 *)(lVar25 + lVar16 * lVar21);
          puVar27[3] = *(undefined1 *)(lVar25 + lVar16 * lVar14);
          puVar27 = puVar27 + 4;
          lVar25 = lVar25 + uVar17;
        }
        lVar14 = lVar14 + 4;
        lVar21 = lVar21 + 4;
        lVar23 = lVar23 + 4;
      }
      for (; (long)uVar29 < lVar15; uVar29 = uVar29 + 1) {
        puVar19 = (undefined1 *)
                  ((long)bottom_im2col->data +
                  uVar12 + bottom_im2col->cstep * uVar29 * bottom_im2col->elemsize);
        iVar18 = iVar9;
        while (bVar30 = iVar18 != 0, iVar18 = iVar18 + -1, bVar30) {
          *puVar27 = *puVar19;
          puVar27 = puVar27 + 1;
          puVar19 = puVar19 + uVar17;
        }
      }
    }
    iVar9 = ((int)uVar13 / 4) * iVar8;
    uVar13 = ((int)uVar13 % 4) * iVar8;
    uVar29 = 0;
    uVar12 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar12 = uVar29;
    }
    uVar28 = local_48 & 0xffffffff;
    if ((int)local_48 < 1) {
      uVar28 = uVar29;
    }
    for (; uVar29 != uVar28; uVar29 = uVar29 + 1) {
      pauVar20 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar29 * top_blob->elemsize + (long)top_blob->data);
      for (uVar22 = 0; (long)(uVar22 | 1) < (long)uVar17; uVar22 = uVar22 + 2) {
        puVar24 = (ulong *)((uVar22 >> 1) * local_58 * local_98._16_8_ + local_98._0_8_);
        pauVar26 = (undefined1 (*) [16])
                   (kernel->cstep * uVar29 * kernel->elemsize + (long)kernel->data);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        if (iVar9 < 1) {
          auVar34 = ZEXT1664((undefined1  [16])0x0);
        }
        else {
          auVar36 = ZEXT1664((undefined1  [16])0x0);
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          auVar34 = ZEXT1664((undefined1  [16])0x0);
          iVar8 = iVar9;
          while( true ) {
            bVar30 = iVar8 == 0;
            iVar8 = iVar8 + -1;
            if (bVar30) break;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *puVar24;
            auVar35 = vpmovsxbw_avx(auVar33);
            auVar31 = *pauVar26;
            auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
            auVar5 = vpunpcklbw_avx(auVar31,auVar33);
            auVar37 = vpunpckhbw_avx(auVar31,auVar33);
            auVar33 = vpshufd_avx(auVar35,0x44);
            auVar31 = vpmaddwd_avx(auVar5,auVar33);
            auVar31 = vpaddd_avx(auVar31,auVar34._0_16_);
            auVar34 = ZEXT1664(auVar31);
            auVar31 = vpmaddwd_avx(auVar33,auVar37);
            auVar31 = vpaddd_avx(auVar31,auVar32._0_16_);
            auVar32 = ZEXT1664(auVar31);
            auVar33 = vpshufd_avx(auVar35,0xee);
            auVar31 = vpmaddwd_avx(auVar5,auVar33);
            auVar31 = vpaddd_avx(auVar31,auVar38._0_16_);
            auVar38 = ZEXT1664(auVar31);
            auVar31 = vpmaddwd_avx(auVar33,auVar37);
            auVar31 = vpaddd_avx(auVar31,auVar36._0_16_);
            auVar36 = ZEXT1664(auVar31);
            puVar24 = puVar24 + 1;
            pauVar26 = pauVar26 + 1;
          }
          auVar31 = vphaddd_avx(auVar34._0_16_,auVar32._0_16_);
          auVar34 = ZEXT1664(auVar31);
          auVar31 = vphaddd_avx(auVar38._0_16_,auVar36._0_16_);
          auVar32 = ZEXT1664(auVar31);
        }
        lVar15 = 0;
        while( true ) {
          if ((int)uVar12 == (int)lVar15) break;
          auVar31 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar24 + lVar15 * 2)));
          auVar31 = vpshuflw_avx(auVar31,0x50);
          auVar33 = vpshufd_avx(auVar31,0x50);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(*pauVar26 + lVar15 * 4);
          auVar31 = vpmovsxbw_avx(auVar31);
          auVar31 = vpshufd_avx(auVar31,0x44);
          auVar35 = vpmullw_avx(auVar33,auVar31);
          auVar33 = vpmulhw_avx(auVar33,auVar31);
          auVar31 = vpunpcklwd_avx(auVar35,auVar33);
          auVar31 = vpaddd_avx(auVar34._0_16_,auVar31);
          auVar34 = ZEXT1664(auVar31);
          auVar31 = vpunpckhwd_avx(auVar35,auVar33);
          auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
          auVar32 = ZEXT1664(auVar31);
          lVar15 = lVar15 + 1;
        }
        *pauVar20 = auVar34._0_16_;
        pauVar20[1] = auVar32._0_16_;
        pauVar20 = pauVar20 + 2;
      }
      while (uVar13 = (uint)uVar22, (int)uVar13 < (int)uVar1) {
        puVar24 = (ulong *)(((uVar13 & 1) + ((uint)(uVar22 >> 1) & 0x7fffffff)) * local_58 *
                            local_98._16_8_ + local_98._0_8_);
        pauVar26 = (undefined1 (*) [16])
                   (kernel->cstep * uVar29 * kernel->elemsize + (long)kernel->data);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        if (0 < iVar9) {
          auVar34 = ZEXT1664((undefined1  [16])0x0);
          auVar36 = ZEXT1664((undefined1  [16])0x0);
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          iVar8 = iVar9;
          while( true ) {
            bVar30 = iVar8 == 0;
            iVar8 = iVar8 + -1;
            auVar31 = auVar32._0_16_;
            auVar33 = auVar34._0_16_;
            auVar35 = auVar36._0_16_;
            auVar37 = auVar38._0_16_;
            if (bVar30) break;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *puVar24;
            auVar3 = vpmovsxbw_avx(auVar5);
            auVar5 = *pauVar26;
            auVar2 = vpcmpgtb_avx((undefined1  [16])0x0,auVar5);
            auVar6 = vpunpcklbw_avx(auVar5,auVar2);
            auVar4 = vpunpckhbw_avx(auVar5,auVar2);
            auVar2 = vpshufd_avx(auVar3,0x44);
            auVar3 = vpmullw_avx(auVar6,auVar2);
            auVar5 = vpmulhw_avx(auVar6,auVar2);
            auVar6 = vpmullw_avx(auVar2,auVar4);
            auVar2 = vpmulhw_avx(auVar2,auVar4);
            auVar4 = vpunpcklwd_avx(auVar3,auVar5);
            auVar31 = vpaddd_avx(auVar31,auVar4);
            auVar32 = ZEXT1664(auVar31);
            auVar31 = vpunpckhwd_avx(auVar3,auVar5);
            auVar31 = vpaddd_avx(auVar33,auVar31);
            auVar34 = ZEXT1664(auVar31);
            auVar31 = vpunpcklwd_avx(auVar6,auVar2);
            auVar31 = vpaddd_avx(auVar35,auVar31);
            auVar36 = ZEXT1664(auVar31);
            auVar31 = vpunpckhwd_avx(auVar6,auVar2);
            auVar31 = vpaddd_avx(auVar37,auVar31);
            auVar38 = ZEXT1664(auVar31);
            puVar24 = (ulong *)((long)puVar24 + 4);
            pauVar26 = pauVar26 + 1;
          }
          auVar5 = vpunpckldq_avx(auVar31,auVar33);
          auVar2 = vpunpckldq_avx(auVar35,auVar37);
          auVar33 = vpunpckhdq_avx(auVar31,auVar33);
          auVar35 = vpunpckhdq_avx(auVar35,auVar37);
          auVar37 = vpunpcklqdq_avx(auVar5,auVar2);
          auVar31 = vpunpckhqdq_avx(auVar5,auVar2);
          auVar31 = vpaddd_avx(auVar37,auVar31);
          auVar37 = vpunpcklqdq_avx(auVar33,auVar35);
          auVar33 = vpunpckhqdq_avx(auVar33,auVar35);
          auVar33 = vpaddd_avx(auVar33,auVar37);
          auVar31 = vpaddd_avx(auVar31,auVar33);
          auVar32 = ZEXT1664(auVar31);
        }
        for (lVar15 = 0; (int)uVar12 != (int)lVar15; lVar15 = lVar15 + 1) {
          auVar31 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar24 + lVar15)),0);
          auVar37 = vpshufd_avx(auVar31,0);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(*pauVar26 + lVar15 * 4);
          auVar31 = vpmovsxbw_avx(auVar35);
          auVar33 = vpmullw_avx(auVar37,auVar31);
          auVar31 = vpmulhw_avx(auVar37,auVar31);
          auVar31 = vpunpcklwd_avx(auVar33,auVar31);
          auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
          auVar32 = ZEXT1664(auVar31);
        }
        *pauVar20 = auVar32._0_16_;
        pauVar20 = pauVar20 + 1;
        uVar22 = (ulong)(uVar13 + 1);
      }
    }
    piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
          free((void *)local_98._0_8_);
        }
        else {
          (*(*(_func_int ***)local_98._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack1to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack1to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack1to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (inch >= 4)
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch / 4 + inch % 4, size / 4 + (size % 4) / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch / 4 + inch % 4, size / 2 + size % 2, 4u, 4, opt.workspace_allocator);
        else
            tmp.create(maxk, inch / 4 + inch % 4, size, 4u, 4, opt.workspace_allocator);
#endif
    }
    else
    {
#if __AVX2__
        if (size >= 4)
            tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#else
        if (size >= 2)
            tmp.create(2 * maxk, inch, size / 2 + size % 2, 1u, 1, opt.workspace_allocator);
        else
            tmp.create(maxk, inch, size, 1u, 1, opt.workspace_allocator);
#endif
    }
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            signed char* tmpptr = tmp.channel(i / 4);

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr[8] = img0[2];
                    tmpptr[9] = img1[2];
                    tmpptr[10] = img2[2];
                    tmpptr[11] = img3[2];
                    tmpptr[12] = img0[3];
                    tmpptr[13] = img1[3];
                    tmpptr[14] = img2[3];
                    tmpptr[15] = img3[3];
                    tmpptr += 16;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];
                    tmpptr[2] = img0[2];
                    tmpptr[3] = img0[3];

                    tmpptr += 4;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            signed char* tmpptr = tmp.channel(i / 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr[4] = img0[1];
                    tmpptr[5] = img1[1];
                    tmpptr[6] = img2[1];
                    tmpptr[7] = img3[1];
                    tmpptr += 8;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img0[1];

                    tmpptr += 2;

                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            int q = 0;
            for (; q + 3 < inch; q += 4)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;
                const signed char* img1 = (const signed char*)bottom_im2col.channel(q + 1) + i;
                const signed char* img2 = (const signed char*)bottom_im2col.channel(q + 2) + i;
                const signed char* img3 = (const signed char*)bottom_im2col.channel(q + 3) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr[1] = img1[0];
                    tmpptr[2] = img2[0];
                    tmpptr[3] = img3[0];
                    tmpptr += 4;

                    img0 += size;
                    img1 += size;
                    img2 += size;
                    img3 += size;
                }
            }
            for (; q < inch; q++)
            {
                const signed char* img0 = (const signed char*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];

                    tmpptr += 1;

                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m256i _sum00_12 = _mm256_setzero_si256();
            __m256i _sum20_32 = _mm256_setzero_si256();

            if (nn4 > 0)
            {
                __m256i _sum10_02 = _mm256_setzero_si256();
                __m256i _sum30_22 = _mm256_setzero_si256();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val0123 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val0123_16 = _mm256_cvtepi8_epi16(_val0123);

                    __m256i _val01_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(1, 1, 0, 0));
                    __m256i _val23_16 = _mm256_permute4x64_epi64(_val0123_16, _MM_SHUFFLE(3, 3, 2, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);
                    __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
                    _sum20_32 = _mm256_dpwssd_epi32(_sum20_32, _val23_16, _w01_16);
                    _sum30_22 = _mm256_dpwssd_epi32(_sum30_22, _val32_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
                    _sum20_32 = _mm256_add_epi32(_sum20_32, _mm256_madd_epi16(_val23_16, _w01_16));
                    _sum30_22 = _mm256_add_epi32(_sum30_22, _mm256_madd_epi16(_val32_16, _w01_16));
#endif

                    tmpptr += 16;
                    kptr0 += 16;
                }

                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);
                _sum20_32 = _mm256_hadd_epi32(_sum20_32, _sum30_22);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
                _sum20_32 = _mm256_permute4x64_epi64(_sum20_32, _MM_SHUFFLE(2, 1, 3, 0));
            }

            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
            __m128i _sum20 = _mm256_extracti128_si256(_sum20_32, 0);
            __m128i _sum30 = _mm256_extracti128_si256(_sum20_32, 1);

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val01 = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);
                __m128i _val23 = _mm_set_epi16(tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[3], tmpptr[2], tmpptr[2], tmpptr[2], tmpptr[2]);

                __m128i _w0123 = _mm_set_epi16(kptr0[3], kptr0[2], kptr0[1], kptr0[0], kptr0[3], kptr0[2], kptr0[1], kptr0[0]);

                __m128i _sl00 = _mm_mullo_epi16(_val01, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val01, _w0123);
                __m128i _sl10 = _mm_mullo_epi16(_val23, _w0123);
                __m128i _sh10 = _mm_mulhi_epi16(_val23, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum20 = _mm_add_epi32(_sum20, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum30 = _mm_add_epi32(_sum30, _mm_unpackhi_epi16(_sl10, _sh10));

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            _mm_storeu_si128((__m128i*)(outptr0 + 8), _sum20);
            _mm_storeu_si128((__m128i*)(outptr0 + 12), _sum30);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

#if __AVX2__
            __m256i _sum00_12 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
#endif

            if (nn4 > 0)
            {
#if __AVX2__
                __m256i _sum10_02 = _mm256_setzero_si256();
#else
                __m128i _sum01 = _mm_setzero_si128();
                __m128i _sum11 = _mm_setzero_si128();
#endif

                int j = 0;
                for (; j < nn4; j++)
                {
#if __AVX2__
                    __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                    __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                    _val01_16 = _mm256_permute4x64_epi64(_val01_16, _MM_SHUFFLE(1, 1, 0, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);

                    __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                    _sum00_12 = _mm256_dpwssd_epi32(_sum00_12, _val01_16, _w01_16);
                    _sum10_02 = _mm256_dpwssd_epi32(_sum10_02, _val10_16, _w01_16);
#else
                    _sum00_12 = _mm256_add_epi32(_sum00_12, _mm256_madd_epi16(_val01_16, _w01_16));
                    _sum10_02 = _mm256_add_epi32(_sum10_02, _mm256_madd_epi16(_val10_16, _w01_16));
#endif
#else
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    _val01 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    _val01 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    __m128i _val0 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(1, 0, 1, 0));
                    __m128i _val1 = _mm_shuffle_epi32(_val01, _MM_SHUFFLE(3, 2, 3, 2));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

#if __XOP__
                    _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                    _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                    _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                    _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
#else
                    _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                    _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                    _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                    _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
#endif
#endif

                    tmpptr += 8;
                    kptr0 += 16;
                }

#if __AVX2__
                _sum00_12 = _mm256_hadd_epi32(_sum00_12, _sum10_02);

                _sum00_12 = _mm256_permute4x64_epi64(_sum00_12, _MM_SHUFFLE(2, 1, 3, 0));
#else
#if __SSSE3__
                _sum00 = _mm_hadd_epi32(_sum00, _sum01);
                _sum10 = _mm_hadd_epi32(_sum10, _sum11);
#else
                __m128i _sum00_sh = _mm_shuffle_epi32(_sum00, 216);
                __m128i _sum01_sh = _mm_shuffle_epi32(_sum01, 216);
                __m128i _sum10_sh = _mm_shuffle_epi32(_sum10, 216);
                __m128i _sum11_sh = _mm_shuffle_epi32(_sum11, 216);

                _sum00 = _mm_unpacklo_epi64(_sum00_sh, _sum01_sh);
                _sum01 = _mm_unpackhi_epi64(_sum00_sh, _sum01_sh);
                _sum10 = _mm_unpacklo_epi64(_sum10_sh, _sum11_sh);
                _sum11 = _mm_unpackhi_epi64(_sum10_sh, _sum11_sh);

                _sum00 = _mm_add_epi32(_sum00, _sum01);
                _sum10 = _mm_add_epi32(_sum10, _sum11);
#endif
#endif
            }

#if __AVX2__
            __m128i _sum00 = _mm256_extracti128_si256(_sum00_12, 0);
            __m128i _sum10 = _mm256_extracti128_si256(_sum00_12, 1);
#endif

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set_epi16(tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[1], tmpptr[0], tmpptr[0], tmpptr[0], tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                _w0123 = _mm_shuffle_epi32(_w0123, _MM_SHUFFLE(1, 0, 1, 0));

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 2;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn4 = (inch / 4) * maxk;
            int nn1 = (inch % 4) * maxk;

            __m128i _sum0 = _mm_setzero_si128();

            if (nn4 > 0)
            {
                __m128i _sum1 = _mm_setzero_si128();
                __m128i _sum2 = _mm_setzero_si128();
                __m128i _sum3 = _mm_setzero_si128();

                int j = 0;
                for (; j < nn4; j++)
                {
                    __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                    __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                    __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                    __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                    _val0 = _mm_shuffle_epi32(_val0, _MM_SHUFFLE(1, 0, 1, 0));

                    __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                    __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                    __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                    __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);

                    __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                    __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                    __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                    __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);

                    _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                    _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                    _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl01, _sh01));
                    _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl01, _sh01));

                    tmpptr += 4;
                    kptr0 += 16;
                }

                // transpose 4x4
                {
                    __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                    _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                    _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                    _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                    _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                    _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                    _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                    _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                    _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
                }

                _sum0 = _mm_add_epi32(_sum0, _sum1);
                _sum2 = _mm_add_epi32(_sum2, _sum3);
                _sum0 = _mm_add_epi32(_sum0, _sum2);
            }

            int j = 0;
            for (; j < nn1; j++)
            {
                __m128i _val = _mm_set1_epi16(tmpptr[0]);

                __m128i _w0123 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                _w0123 = _mm_cvtepi8_epi16(_w0123);
#else
                __m128i _extw0123 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w0123);
                _w0123 = _mm_unpacklo_epi8(_w0123, _extw0123);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val, _w0123);
                __m128i _sh00 = _mm_mulhi_epi16(_val, _w0123);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}